

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFun.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  string string2;
  string string1;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  string local_68;
  string local_48;
  
  local_80 = 0;
  local_78 = 0;
  local_a0 = 0;
  local_98 = 0;
  local_a8 = &local_98;
  local_88 = &local_78;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter two strings.",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"String 1: ",10);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x80);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_88,cVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"String 2: ",10);
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x80);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_a8,cVar1);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_88,local_88 + local_80);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_a8,local_a8 + local_a0);
  bVar2 = StrComp(&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = "The strings are different.";
  if (bVar2) {
    pcVar3 = "The strings are the same.";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar3,0x1a - (ulong)bVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  return 0;
}

Assistant:

int main()
{
    string string1;
    string string2;

    cout << "Enter two strings." << endl;
    cout << "String 1: ";
    getline(cin, string1);
    cout << "String 2: ";
    getline(cin, string2);

    bool same = StrComp(string1, string2);

    if(same)
    {
        cout << "The strings are the same." << endl;
    }
    else
    {
        cout << "The strings are different." << endl;
    }

    return 0;
}